

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

bool GetBrepFormFaceIndex
               (ON_Extrusion *extrusion,int extrusion_profile_index,
               double extrusion_profile_parameter,bool bCountProfileDiscontinuities,
               int *brep_form_face_index,ON_Interval *profile_segment_domain)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_Curve *pOVar4;
  undefined7 in_register_00000011;
  int profile_index;
  int iVar5;
  double t1;
  double t0;
  double t;
  double local_68;
  double local_60;
  int *local_58;
  ON_Interval *local_50;
  double local_48;
  undefined4 local_3c;
  double local_38;
  
  local_38 = extrusion_profile_parameter;
  iVar2 = ON_Extrusion::ProfileCount(extrusion);
  local_60 = -1.23432101234321e+308;
  local_68 = -1.23432101234321e+308;
  if ((local_38 != -1.23432101234321e+308) || (NAN(local_38))) {
    bVar1 = true;
    if (iVar2 < 1) {
      iVar5 = 0;
    }
    else {
      profile_index = 0;
      iVar5 = 0;
      local_58 = brep_form_face_index;
      local_50 = profile_segment_domain;
      local_3c = (int)CONCAT71(in_register_00000011,bCountProfileDiscontinuities);
      do {
        pOVar4 = ON_Extrusion::Profile(extrusion,profile_index);
        if ((((pOVar4 == (ON_Curve *)0x0) ||
             (bVar1 = ON_Curve::GetDomain(pOVar4,&local_60,&local_68), !bVar1)) ||
            (bVar1 = ON_IsValid(local_60), !bVar1)) ||
           ((bVar1 = ON_IsValid(local_68), !bVar1 || (local_68 <= local_60)))) {
          bVar1 = false;
          brep_form_face_index = local_58;
          profile_segment_domain = local_50;
          goto LAB_003ccd24;
        }
        local_48 = local_68;
        if ((char)local_3c != '\0') {
          while( true ) {
            local_48 = local_68;
            iVar3 = (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x36])
                              (local_60,local_68,0x3feffec097f5af8a,0x3e500000000002c4,pOVar4,0xc,
                               &local_48,0,0);
            if ((((char)iVar3 == '\0') || (local_48 <= local_60)) || (local_68 <= local_48))
            goto LAB_003ccce9;
            if (((profile_index == extrusion_profile_index) && (local_60 <= local_38)) &&
               (local_38 < local_48)) break;
            iVar5 = iVar5 + 1;
            local_60 = local_48;
          }
          local_68 = local_48;
        }
LAB_003ccce9:
        iVar5 = (uint)(profile_index != extrusion_profile_index) + iVar5;
      } while ((profile_index != extrusion_profile_index) &&
              (profile_index = profile_index + 1, profile_index != iVar2));
      bVar1 = true;
      brep_form_face_index = local_58;
      profile_segment_domain = local_50;
    }
LAB_003ccd24:
    if (bVar1) goto LAB_003ccd2c;
  }
  else {
    iVar5 = extrusion_profile_index;
    if ((iVar2 == extrusion_profile_index) ||
       (((pOVar4 = ON_Extrusion::Profile(extrusion,extrusion_profile_index),
         pOVar4 != (ON_Curve *)0x0 &&
         (bVar1 = ON_Curve::GetDomain(pOVar4,&local_60,&local_68), bVar1)) &&
        ((bVar1 = ON_IsValid(local_60), bVar1 &&
         ((bVar1 = ON_IsValid(local_68), bVar1 && (local_60 < local_68)))))))) {
LAB_003ccd2c:
      if (brep_form_face_index != (int *)0x0) {
        *brep_form_face_index = iVar5;
      }
      if (iVar2 <= extrusion_profile_index || profile_segment_domain == (ON_Interval *)0x0) {
        return true;
      }
      ON_Interval::Set(profile_segment_domain,local_60,local_68);
      return true;
    }
  }
  return false;
}

Assistant:

static bool GetBrepFormFaceIndex(
        const ON_Extrusion& extrusion,
        int extrusion_profile_index,
        double extrusion_profile_parameter,
        bool bCountProfileDiscontinuities,
        int* brep_form_face_index,
        ON_Interval* profile_segment_domain
        )
{
  // When extrusion_profile_index = profile_count,
  // it means the caller is looking for the index of
  // the bottom cap.
  int profile_segment_count = 0;
  const int profile_count = extrusion.ProfileCount();
  double t0 = ON_UNSET_VALUE;
  double t1 = ON_UNSET_VALUE;
  const ON_Curve* profile;
  if ( ON_UNSET_VALUE == extrusion_profile_parameter )
  {
    if ( extrusion_profile_index != profile_count )
    {
      profile = extrusion.Profile(extrusion_profile_index);
      if (    0 == profile
           || !profile->GetDomain(&t0,&t1) 
           || !ON_IsValid(t0)
           || !ON_IsValid(t1) 
           || !(t0 < t1)
         )
      {
        return false;
      }
    }
    profile_segment_count = extrusion_profile_index;
  }
  else
  {
    for ( int i = 0; i < profile_count; i++ )
    {
      profile = extrusion.Profile(i);
      if ( 0 == profile )
        return false;
      // It is important to use the original profile, "profile_segment"
      // and not the trimmed copy in the GetNextDiscontinuity() loop
      // so the code that creates this brep divides the extrusion profile
      // exactly the same way as the code that calculates component indices.
      if (    0 == profile
           || !profile->GetDomain(&t0,&t1) 
           || !ON_IsValid(t0)
           || !ON_IsValid(t1) 
           || !(t0 < t1)
         )
      {
        return false;
      }

      double t = t1;
      if ( bCountProfileDiscontinuities )
      {
        while ( GetNextProfileSegmentDiscontinuity(profile,t0,t1,&t) )
        {
          if ( t0 < t && t < t1 )
          {
            if ( i == extrusion_profile_index 
                 && t0 <= extrusion_profile_parameter 
                 && extrusion_profile_parameter < t 
               )
            {
              t1 = t;
              break;
            }
            t0 = t;
            t = t1;
            profile_segment_count++;
            continue;
          }
          break;
        }
      }
      if ( i == extrusion_profile_index )
        break;
      profile_segment_count++;
    }
  }

  if ( 0 != brep_form_face_index )
    *brep_form_face_index = profile_segment_count;

  if ( 0 != profile_segment_domain && extrusion_profile_index < profile_count )
    profile_segment_domain->Set(t0,t1);

  return true;
}